

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_pack(REF_NODE ref_node,REF_INT *o2n,REF_INT *n2o)

{
  int iVar1;
  int iVar2;
  REF_GLOB *pRVar3;
  REF_GLOB *pRVar4;
  REF_INT *pRVar5;
  REF_INT *pRVar6;
  REF_DBL *pRVar7;
  uint uVar8;
  REF_NODE in_RAX;
  long lVar9;
  ulong uVar10;
  int iVar11;
  undefined8 uVar12;
  long *plVar13;
  long lVar14;
  REF_DBL *pRVar15;
  ulong uVar16;
  char *pcVar17;
  REF_NODE copy;
  REF_NODE local_28;
  
  local_28 = in_RAX;
  uVar8 = ref_node_deep_copy(&local_28,ref_node->ref_mpi,ref_node);
  if (uVar8 == 0) {
    iVar1 = ref_node->n;
    lVar9 = (long)iVar1;
    if (0 < lVar9) {
      pRVar3 = local_28->global;
      pRVar4 = ref_node->global;
      lVar14 = 0;
      do {
        pRVar4[lVar14] = pRVar3[n2o[lVar14]];
        lVar14 = lVar14 + 1;
      } while (lVar9 != lVar14);
    }
    iVar2 = ref_node->max;
    iVar11 = -1;
    if (iVar1 < iVar2) {
      plVar13 = ref_node->global + lVar9;
      lVar9 = -3 - lVar9;
      do {
        *plVar13 = lVar9;
        plVar13 = plVar13 + 1;
        lVar14 = iVar2 + lVar9;
        lVar9 = lVar9 + -1;
      } while (lVar14 != -2);
      ref_node->global[(long)iVar2 + -1] = -1;
      iVar11 = -2 - iVar1;
    }
    ref_node->blank = iVar11;
    if (0 < ref_node->n) {
      pRVar5 = local_28->sorted_local;
      pRVar6 = ref_node->sorted_local;
      lVar9 = 0;
      do {
        pRVar6[lVar9] = o2n[pRVar5[lVar9]];
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_node->n);
    }
    if (0 < ref_node->n) {
      pRVar5 = local_28->part;
      pRVar6 = ref_node->part;
      lVar9 = 0;
      do {
        pRVar6[lVar9] = pRVar5[n2o[lVar9]];
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_node->n);
    }
    uVar10 = (ulong)(uint)ref_node->n;
    if (0 < ref_node->n) {
      pRVar5 = local_28->age;
      pRVar6 = ref_node->age;
      lVar9 = 0;
      do {
        pRVar6[lVar9] = pRVar5[n2o[lVar9]];
        lVar9 = lVar9 + 1;
        uVar10 = (ulong)ref_node->n;
      } while (lVar9 < (long)uVar10);
    }
    if (0 < (int)uVar10) {
      pRVar7 = local_28->real;
      pRVar15 = ref_node->real;
      uVar16 = 0;
      do {
        iVar1 = n2o[uVar16];
        lVar9 = 0;
        do {
          pRVar15[lVar9] = pRVar7[(long)iVar1 * 0xf + lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0xf);
        uVar16 = uVar16 + 1;
        pRVar15 = pRVar15 + 0xf;
      } while (uVar16 != (uVar10 & 0xffffffff));
    }
    lVar9 = (long)ref_node->naux;
    if (0 < (int)uVar10 && 0 < lVar9) {
      pRVar7 = local_28->aux;
      iVar1 = local_28->naux;
      pRVar15 = ref_node->aux;
      uVar16 = 0;
      do {
        iVar2 = n2o[uVar16];
        lVar14 = 0;
        do {
          pRVar15[lVar14] = pRVar7[(long)iVar2 * (long)iVar1 + lVar14];
          lVar14 = lVar14 + 1;
        } while (lVar9 != lVar14);
        uVar16 = uVar16 + 1;
        pRVar15 = pRVar15 + lVar9;
      } while (uVar16 != (uVar10 & 0xffffffff));
    }
    uVar8 = ref_node_free(local_28);
    if (uVar8 == 0) {
      return 0;
    }
    pcVar17 = "release copy";
    uVar12 = 0xd2;
  }
  else {
    pcVar17 = "make a copy first";
    uVar12 = 0xb2;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar12,
         "ref_node_pack",(ulong)uVar8,pcVar17);
  return uVar8;
}

Assistant:

REF_FCN REF_STATUS ref_node_pack(REF_NODE ref_node, REF_INT *o2n,
                                 REF_INT *n2o) {
  REF_INT i, node;
  REF_NODE copy;
  RSS(ref_node_deep_copy(&copy, ref_node_mpi(ref_node), ref_node),
      "make a copy first");

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->global[node] = copy->global[n2o[node]];
  if (ref_node_n(ref_node) < ref_node_max(ref_node)) {
    for (node = ref_node_n(ref_node); node < ref_node_max(ref_node); node++)
      ref_node->global[node] = index2next(node + 1);
    ref_node->global[(ref_node->max) - 1] = REF_EMPTY;
    ref_node->blank = index2next(ref_node_n(ref_node));
  } else {
    ref_node->blank = REF_EMPTY;
  }

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->sorted_local[node] = o2n[copy->sorted_local[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->part[node] = copy->part[n2o[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    ref_node->age[node] = copy->age[n2o[node]];

  for (node = 0; node < ref_node_n(ref_node); node++)
    for (i = 0; i < REF_NODE_REAL_PER; i++)
      ref_node_real(ref_node, i, node) = ref_node_real(copy, i, n2o[node]);

  if (ref_node_naux(ref_node) > 0) {
    for (node = 0; node < ref_node_n(ref_node); node++)
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) = ref_node_aux(copy, i, n2o[node]);
  }

  RSS(ref_node_free(copy), "release copy");

  return REF_SUCCESS;
}